

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O2

string * __thiscall
duckdb::LogicalOperator::ColumnBindingsToString_abi_cxx11_
          (string *__return_storage_ptr__,LogicalOperator *this,
          vector<duckdb::ColumnBinding,_true> *bindings)

{
  const_reference this_00;
  ulong __n;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ::std::__cxx11::string::string((string *)&local_70,"{",(allocator *)&local_50);
  for (__n = 0; __n < (ulong)(*(long *)&this->type - (long)this->_vptr_LogicalOperator >> 4);
      __n = __n + 1) {
    if (__n != 0) {
      ::std::__cxx11::string::append((char *)&local_70);
    }
    this_00 = vector<duckdb::ColumnBinding,_true>::get<true>
                        ((vector<duckdb::ColumnBinding,_true> *)this,__n);
    ColumnBinding::ToString_abi_cxx11_(&local_50,this_00);
    ::std::__cxx11::string::append((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::operator+(__return_storage_ptr__,&local_70,"}");
  ::std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

string LogicalOperator::ColumnBindingsToString(const vector<ColumnBinding> &bindings) {
	string result = "{";
	for (idx_t i = 0; i < bindings.size(); i++) {
		if (i != 0) {
			result += ", ";
		}
		result += bindings[i].ToString();
	}
	return result + "}";
}